

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CS248::Application::loadScene(Application *this,char *filename)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  SceneInfo *sceneInfo;
  undefined8 auStack_330 [38];
  undefined8 uStack_200;
  double local_1f8;
  double dStack_1f0;
  double local_1e8;
  double dStack_1e0;
  double local_1d8;
  double local_1d0;
  double dStack_1c8;
  double local_1c0;
  double dStack_1b8;
  double local_1b0;
  double dStack_1a8;
  double local_1a0;
  double dStack_198;
  double local_190;
  double dStack_188;
  double local_180;
  size_t local_130;
  size_t sStack_128;
  double local_120;
  double local_118 [6];
  double dStack_e8;
  double local_e0;
  double dStack_d8;
  double local_d0;
  double dStack_c8;
  double local_c0;
  double dStack_b8;
  double local_b0;
  double dStack_a8;
  double local_a0;
  size_t local_50;
  size_t sStack_48;
  double local_40;
  
  uStack_200 = 0x18bfc0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Loading scene from file ",0x18);
  if (filename == (char *)0x0) {
    uStack_200 = 0x18bff8;
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x31ebd0);
  }
  else {
    uStack_200 = 0x18bfcd;
    sVar4 = strlen(filename);
    uStack_200 = 0x18bfdf;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,filename,sVar4);
  }
  uStack_200 = 0x18c00c;
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
  uStack_200 = 0x18c017;
  std::ostream::put(-0x30);
  uStack_200 = 0x18c01f;
  std::ostream::flush();
  local_118[4] = (this->camera).fClip;
  local_118[0] = (this->camera).hFov;
  local_118[1] = (this->camera).vFov;
  local_118[2] = (this->camera).ar;
  local_118[3] = (this->camera).nClip;
  local_118[5] = (this->camera).pos.x;
  dStack_e8 = (this->camera).pos.y;
  local_e0 = (this->camera).pos.z;
  dStack_d8 = (this->camera).targetPos.x;
  local_d0 = (this->camera).targetPos.y;
  dStack_c8 = (this->camera).targetPos.z;
  local_c0 = (this->camera).phi;
  dStack_b8 = (this->camera).theta;
  local_b0 = (this->camera).r;
  dStack_a8 = (this->camera).minR;
  local_a0 = (this->camera).maxR;
  lVar5 = 0x80;
  do {
    puVar1 = (undefined8 *)((long)(this->camera).c2w.entries + lVar5 + -0x80);
    uVar2 = puVar1[1];
    *(undefined8 *)((long)local_118 + lVar5) = *puVar1;
    *(undefined8 *)((long)local_118 + lVar5 + 8) = uVar2;
    *(undefined8 *)((long)local_118 + lVar5 + 0x10) =
         *(undefined8 *)((long)(this->camera).c2w.entries + lVar5 + -0x70);
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 200);
  local_40 = (this->camera).screenDist;
  local_50 = (this->camera).screenW;
  sStack_48 = (this->camera).screenH;
  local_1d8 = (this->canonicalCamera).fClip;
  local_1f8 = (this->canonicalCamera).hFov;
  dStack_1f0 = (this->canonicalCamera).vFov;
  local_1e8 = (this->canonicalCamera).ar;
  dStack_1e0 = (this->canonicalCamera).nClip;
  local_1d0 = (this->canonicalCamera).pos.x;
  dStack_1c8 = (this->canonicalCamera).pos.y;
  local_1c0 = (this->canonicalCamera).pos.z;
  dStack_1b8 = (this->canonicalCamera).targetPos.x;
  local_1b0 = (this->canonicalCamera).targetPos.y;
  dStack_1a8 = (this->canonicalCamera).targetPos.z;
  local_1a0 = (this->canonicalCamera).phi;
  dStack_198 = (this->canonicalCamera).theta;
  local_190 = (this->canonicalCamera).r;
  dStack_188 = (this->canonicalCamera).minR;
  local_180 = (this->canonicalCamera).maxR;
  lVar5 = 0x1b8;
  do {
    puVar1 = (undefined8 *)((long)&(this->super_Renderer)._vptr_Renderer + lVar5);
    uVar2 = puVar1[1];
    *(undefined8 *)((long)auStack_330 + lVar5) = *puVar1;
    *(undefined8 *)((long)auStack_330 + lVar5 + 8) = uVar2;
    *(undefined8 *)((long)auStack_330 + lVar5 + 0x10) = *(undefined8 *)((long)&this->action + lVar5)
    ;
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x200);
  local_120 = (this->canonicalCamera).screenDist;
  local_130 = (this->canonicalCamera).screenW;
  sStack_128 = (this->canonicalCamera).screenH;
  uStack_200 = 0x18c1c6;
  sceneInfo = (SceneInfo *)operator_new(0x18);
  (sceneInfo->nodes).super__Vector_base<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (sceneInfo->nodes).super__Vector_base<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (sceneInfo->nodes).super__Vector_base<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_200 = 0x18c1e2;
  iVar3 = Collada::ColladaParser::load(filename,sceneInfo);
  if (-1 < iVar3) {
    uStack_200 = 0x18c1f1;
    load(this,sceneInfo);
    uStack_200 = 0x18c200;
    loadSkeleton(this,filename,this->scene);
    uStack_200 = 0x18c215;
    memcpy(&this->camera,local_118,0xe0);
    uStack_200 = 0x18c225;
    memcpy(&this->canonicalCamera,&local_1f8,0xe0);
    return;
  }
  uStack_200 = 0x18c24b;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Warning: scene file failed to load.",0x23);
  uStack_200 = 0x18c25f;
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
  uStack_200 = 0x18c26a;
  std::ostream::put(-0x30);
  uStack_200 = 0x18c272;
  std::ostream::flush();
  uStack_200 = 0x18c27a;
  std::vector<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_>::~vector
            ((vector<CS248::Collada::Node,_std::allocator<CS248::Collada::Node>_> *)sceneInfo);
  operator_delete(sceneInfo);
  return;
}

Assistant:

void Application::loadScene(const char *filename) {
  cerr << "Loading scene from file " << filename << endl;

  Camera originalCamera = camera;
  Camera originalCanonicalCamera = canonicalCamera;

  Collada::SceneInfo *sceneInfo = new Collada::SceneInfo();
  if (Collada::ColladaParser::load(filename, sceneInfo) < 0) {
    cerr << "Warning: scene file failed to load." << endl;
    delete sceneInfo;
    return;
  }
  load(sceneInfo);
  loadSkeleton(filename, scene);

  camera = originalCamera;
  canonicalCamera = originalCanonicalCamera;
}